

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O1

void __thiscall vpl::Scope::CallFunction(Scope *this,string *name)

{
  pointer pNVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  bool *pbVar4;
  long lVar5;
  int iVar6;
  pointer pFVar7;
  ulong uVar8;
  char local_45 [13];
  string *local_38;
  
  local_45[3] = 0x23;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(this->out_,local_45 + 3,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"void vpl::Scope::CallFunction(const std::string &)",0x32);
  local_45[4] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 4,1);
  local_38 = name;
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->func_name_map_,name);
  pFVar7 = (this->functions_).super__Vector_base<vpl::Function,_std::allocator<vpl::Function>_>.
           _M_impl.super__Vector_impl_data._M_start + *pmVar3;
  pNVar1 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pNVar1;
  if (lVar5 == 0) {
    iVar6 = 0;
  }
  else {
    lVar5 = (lVar5 >> 3) * -0x71c71c71c71c71c7;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    pbVar4 = &pNVar1->is_global_;
    iVar6 = 0;
    do {
      if (*pbVar4 == false) {
        iVar6 = iVar6 + ((NameScope *)(pbVar4 + -0x40))->total_size_;
      }
      pbVar4 = pbVar4 + 0x48;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  poVar2 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    push ",9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar6);
  local_45[5] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 5,1);
  poVar2 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    push %",10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  local_45[6] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 6,1);
  std::__ostream_insert<char,std::char_traits<char>>(this->out_,"    add\n",8);
  poVar2 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    pop %",9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  local_45[7] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 7,1);
  if (*(pointer *)
       ((long)&(pFVar7->args_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl + 8) !=
      *(pointer *)
       &(pFVar7->args_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl) {
    uVar8 = 0;
    do {
      poVar2 = this->out_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    pop !",9);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
      local_45[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45,1);
      poVar2 = this->out_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    push %",10);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
      local_45[1] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 1,1);
      std::__ostream_insert<char,std::char_traits<char>>(this->out_,"    push 1\n",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(this->out_,"    add\n",8);
      poVar2 = this->out_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    pop %",9);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
      local_45[2] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 2,1);
      this->cur_stack_pos_ = this->cur_stack_pos_ + -1;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)*(pointer *)
                                    ((long)&(pFVar7->args_).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl + 8) -
                             *(long *)&(pFVar7->args_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl >> 5));
  }
  poVar2 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    push %",10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  local_45[8] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 8,1);
  poVar2 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    push ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(this->out_,"    sub\n",8);
  poVar2 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    pop %",9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  local_45[9] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 9,1);
  poVar2 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    call ",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
  local_45[10] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 10,1);
  poVar2 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    pop %",9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  local_45[0xb] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 0xb,1);
  poVar2 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    push %",10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,3);
  local_45[0xc] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_45 + 0xc,1);
  return;
}

Assistant:

void CallFunction(const std::string& name) {
        LOG
        Function* func = &functions_[func_name_map_[name]];

        int frame_size = 0;
        for (size_t i = 0; i < scopes_.size(); ++i) {
            if (!scopes_[i].IsGlobal()) {
                frame_size += scopes_[i].Size();
            }
        }

        out_ << "    push " << frame_size << '\n';
        out_ << "    push %" << StackPointerRegister() << '\n';
        out_ << "    add\n";
        out_ << "    pop %" << StackPointerRegister() << '\n';

        for (size_t i = 0; i < func->GetArgs().size(); ++i) {
            out_ << "    pop !" << StackPointerRegister() << '\n';
            out_ << "    push %" << StackPointerRegister() << '\n';
            out_ << "    push 1\n";
            out_ << "    add\n";
            out_ << "    pop %" << StackPointerRegister() << '\n';
            Pop();
        }
        out_ << "    push %" << StackPointerRegister() << '\n';
        out_ << "    push " << func->GetArgs().size() << "\n";
        out_ << "    sub\n";
        out_ << "    pop %" << StackPointerRegister() << '\n';

        out_ << "    call " << name << '\n';
        out_ << "    pop %" << StackPointerRegister() << '\n';
        out_ << "    push %" << RetRegister() << '\n';
    }